

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int FindMsgSeanet(uchar *buf,int buflen,uchar **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyseBufSeanet(buf,buflen);
    if (iVar1 == 0) {
      return 0;
    }
    buf = *pFoundMsg + 1;
    *pFoundMsg = buf;
    iVar1 = *pFoundMsgTmpLen;
    buflen = iVar1 + -1;
    *pFoundMsgTmpLen = buflen;
  } while (0xb < iVar1);
  *pFoundMsg = (uchar *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindMsgSeanet(unsigned char* buf, int buflen, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyseBufSeanet(*pFoundMsg, *pFoundMsgTmpLen) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_MESSAGE_LEN_SEANET)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}